

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O0

QSize QtMWidgets::qSmartMinSize
                (QSize *sizeHint,QSize *minSizeHint,QSize *minSize,QSize *maxSize,
                QSizePolicy *sizePolicy)

{
  Policy PVar1;
  int iVar2;
  int *piVar3;
  QSize QVar4;
  QSize local_60;
  QSize local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  QSize local_40;
  QSize s;
  QSizePolicy *sizePolicy_local;
  QSize *maxSize_local;
  QSize *minSize_local;
  QSize *minSizeHint_local;
  QSize *sizeHint_local;
  
  s = (QSize)sizePolicy;
  QSize::QSize(&local_40,0,0);
  PVar1 = QSizePolicy::horizontalPolicy((QSizePolicy *)s);
  if (PVar1 != Ignored) {
    PVar1 = QSizePolicy::horizontalPolicy((QSizePolicy *)s);
    if ((PVar1 & Maximum) == Fixed) {
      local_44 = QSize::width(sizeHint);
      local_48 = QSize::width(minSizeHint);
      piVar3 = qMax<int>(&local_44,&local_48);
      QSize::setWidth(&local_40,*piVar3);
    }
    else {
      iVar2 = QSize::width(minSizeHint);
      QSize::setWidth(&local_40,iVar2);
    }
  }
  PVar1 = QSizePolicy::verticalPolicy((QSizePolicy *)s);
  if (PVar1 != Ignored) {
    PVar1 = QSizePolicy::verticalPolicy((QSizePolicy *)s);
    if ((PVar1 & Maximum) == Fixed) {
      local_4c = QSize::height(sizeHint);
      local_50 = QSize::height(minSizeHint);
      piVar3 = qMax<int>(&local_4c,&local_50);
      QSize::setHeight(&local_40,*piVar3);
    }
    else {
      iVar2 = QSize::height(minSizeHint);
      QSize::setHeight(&local_40,iVar2);
    }
  }
  local_58 = QSize::boundedTo(&local_40,maxSize);
  local_40 = local_58;
  iVar2 = QSize::width(minSize);
  if (0 < iVar2) {
    iVar2 = QSize::width(minSize);
    QSize::setWidth(&local_40,iVar2);
  }
  iVar2 = QSize::height(minSize);
  if (0 < iVar2) {
    iVar2 = QSize::height(minSize);
    QSize::setHeight(&local_40,iVar2);
  }
  QSize::QSize(&local_60,0,0);
  QVar4 = QSize::expandedTo(&local_40,&local_60);
  return QVar4;
}

Assistant:

QSize qSmartMinSize( const QSize & sizeHint, const QSize & minSizeHint,
	const QSize & minSize, const QSize & maxSize,
	const QSizePolicy & sizePolicy )
{
	QSize s( 0, 0 );

	if( sizePolicy.horizontalPolicy() != QSizePolicy::Ignored )
	{
		if( sizePolicy.horizontalPolicy() & QSizePolicy::ShrinkFlag )
			s.setWidth( minSizeHint.width() );
		else
			s.setWidth( qMax( sizeHint.width(), minSizeHint.width() ) );
	}

	if( sizePolicy.verticalPolicy() != QSizePolicy::Ignored )
	{
		if( sizePolicy.verticalPolicy() & QSizePolicy::ShrinkFlag )
			s.setHeight( minSizeHint.height() );
		else
			s.setHeight( qMax( sizeHint.height(), minSizeHint.height() ) );
	}

	s = s.boundedTo( maxSize );

	if( minSize.width() > 0 )
		s.setWidth( minSize.width() );

	if( minSize.height() > 0 )
		s.setHeight( minSize.height() );

	return s.expandedTo( QSize( 0, 0 ) );
}